

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

DistantLight * __thiscall
pstd::pmr::polymorphic_allocator<std::byte>::
new_object<pbrt::DistantLight,pbrt::Transform&,pbrt::SpectrumHandle&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
          (polymorphic_allocator<std::byte> *this,Transform *args,SpectrumHandle *args_1,
          float *args_2,polymorphic_allocator<std::byte> *args_3)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*this->memoryResource->_vptr_memory_resource[2])(this->memoryResource,0xd8,8);
  construct<pbrt::DistantLight,pbrt::Transform&,pbrt::SpectrumHandle&,float&,pstd::pmr::polymorphic_allocator<std::byte>&>
            (this,(DistantLight *)CONCAT44(extraout_var,iVar1),args,args_1,args_2,args_3);
  return (DistantLight *)CONCAT44(extraout_var,iVar1);
}

Assistant:

T *new_object(Args &&... args) {
        // NOTE: this doesn't handle constructors that throw exceptions...
        T *p = allocate_object<T>();
        construct(p, std::forward<Args>(args)...);
        return p;
    }